

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-close-reset.c
# Opt level: O2

void do_close(uv_tcp_t *handle)

{
  int iVar1;
  char *pcVar2;
  undefined8 uStack_10;
  
  if (shutdown_before_close == '\x01') {
    iVar1 = uv_shutdown(&shutdown_req,(uv_stream_t *)handle,shutdown_cb);
    if (iVar1 == 0) {
      iVar1 = uv_tcp_close_reset(handle,close_cb);
      if (iVar1 == -0x16) {
LAB_00153198:
        uv_close((uv_handle_t *)&tcp_server,(uv_close_cb)0x0);
        return;
      }
      pcVar2 = "UV_EINVAL == uv_tcp_close_reset(handle, close_cb)";
      uStack_10 = 0x43;
    }
    else {
      pcVar2 = "0 == uv_shutdown(&shutdown_req, (uv_stream_t*) handle, shutdown_cb)";
      uStack_10 = 0x42;
    }
  }
  else {
    iVar1 = uv_tcp_close_reset(handle,close_cb);
    if (iVar1 == 0) {
      iVar1 = uv_shutdown(&shutdown_req,(uv_stream_t *)handle,shutdown_cb);
      if (iVar1 == -0x6b) goto LAB_00153198;
      pcVar2 = "UV_ENOTCONN == uv_shutdown(&shutdown_req, (uv_stream_t*) handle, shutdown_cb)";
      uStack_10 = 0x46;
    }
    else {
      pcVar2 = "0 == uv_tcp_close_reset(handle, close_cb)";
      uStack_10 = 0x45;
    }
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-tcp-close-reset.c"
          ,uStack_10,pcVar2);
  abort();
}

Assistant:

static void do_close(uv_tcp_t* handle) {
  if (shutdown_before_close == 1) {
    ASSERT(0 == uv_shutdown(&shutdown_req, (uv_stream_t*) handle, shutdown_cb));
    ASSERT(UV_EINVAL == uv_tcp_close_reset(handle, close_cb));
  } else {
    ASSERT(0 == uv_tcp_close_reset(handle, close_cb));
    ASSERT(UV_ENOTCONN == uv_shutdown(&shutdown_req, (uv_stream_t*) handle, shutdown_cb));
  }

  uv_close((uv_handle_t*) &tcp_server, NULL);
}